

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_implementation.cc
# Opt level: O3

size_t testbench::machine::availability::count(void)

{
  long lVar1;
  
  if ((anonymous_namespace)::machines == (long *)0x0) {
    (anonymous_namespace)::machines = (long *)operator_new(0x30);
    *(anonymous_namespace)::machines = 0;
    (anonymous_namespace)::machines[1] = 0;
    (anonymous_namespace)::machines[2] = 0;
    (anonymous_namespace)::machines[3] = 0;
    (anonymous_namespace)::machines[2] = 0;
    (anonymous_namespace)::machines[3] = 0;
    (anonymous_namespace)::machines[4] = 0;
    (anonymous_namespace)::machines[5] = 0;
    lVar1 = 0;
  }
  else {
    lVar1 = *(anonymous_namespace)::machines;
  }
  return (anonymous_namespace)::machines[1] - lVar1 >> 3;
}

Assistant:

size_t machine::availability::count()
{
    factory_init();
    return machines->names.size();
}